

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cpp
# Opt level: O3

void anon_unknown.dwarf_15e5b2::Distortion_setParamf(EffectProps *props,ALenum param,float val)

{
  effect_exception *this;
  
  switch(param) {
  case 1:
    if ((0.0 <= val) && (val <= 1.0)) {
LAB_00145a16:
      (props->Reverb).Density = val;
      return;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Distortion edge out of range");
    break;
  case 2:
    if ((0.01 <= val) && (val <= 1.0)) {
      props = (EffectProps *)&(props->Reverb).Diffusion;
      goto LAB_00145a16;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Distortion gain out of range");
    break;
  case 3:
    if ((80.0 <= val) && (val <= 24000.0)) {
      props = (EffectProps *)&(props->Reverb).Gain;
      goto LAB_00145a16;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Distortion low-pass cutoff out of range");
    break;
  case 4:
    if ((80.0 <= val) && (val <= 24000.0)) {
      props = (EffectProps *)&(props->Reverb).GainHF;
      goto LAB_00145a16;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Distortion EQ center out of range");
    break;
  case 5:
    if ((80.0 <= val) && (val <= 24000.0)) {
      props = (EffectProps *)&(props->Reverb).DecayTime;
      goto LAB_00145a16;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Distortion EQ bandwidth out of range");
    break;
  default:
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (this,0xa002,"Invalid distortion float property 0x%04x",(ulong)(uint)param);
  }
  __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void Distortion_setParamf(EffectProps *props, ALenum param, float val)
{
    switch(param)
    {
    case AL_DISTORTION_EDGE:
        if(!(val >= AL_DISTORTION_MIN_EDGE && val <= AL_DISTORTION_MAX_EDGE))
            throw effect_exception{AL_INVALID_VALUE, "Distortion edge out of range"};
        props->Distortion.Edge = val;
        break;

    case AL_DISTORTION_GAIN:
        if(!(val >= AL_DISTORTION_MIN_GAIN && val <= AL_DISTORTION_MAX_GAIN))
            throw effect_exception{AL_INVALID_VALUE, "Distortion gain out of range"};
        props->Distortion.Gain = val;
        break;

    case AL_DISTORTION_LOWPASS_CUTOFF:
        if(!(val >= AL_DISTORTION_MIN_LOWPASS_CUTOFF && val <= AL_DISTORTION_MAX_LOWPASS_CUTOFF))
            throw effect_exception{AL_INVALID_VALUE, "Distortion low-pass cutoff out of range"};
        props->Distortion.LowpassCutoff = val;
        break;

    case AL_DISTORTION_EQCENTER:
        if(!(val >= AL_DISTORTION_MIN_EQCENTER && val <= AL_DISTORTION_MAX_EQCENTER))
            throw effect_exception{AL_INVALID_VALUE, "Distortion EQ center out of range"};
        props->Distortion.EQCenter = val;
        break;

    case AL_DISTORTION_EQBANDWIDTH:
        if(!(val >= AL_DISTORTION_MIN_EQBANDWIDTH && val <= AL_DISTORTION_MAX_EQBANDWIDTH))
            throw effect_exception{AL_INVALID_VALUE, "Distortion EQ bandwidth out of range"};
        props->Distortion.EQBandwidth = val;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid distortion float property 0x%04x", param};
    }
}